

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer-from-check.c
# Opt level: O2

void check_cb(uv_check_t *handle)

{
  int iVar1;
  char *__format;
  char *pcVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  if (handle == &check_handle) {
    eval_a = 6;
    eval_b = (int64_t)recv_cnt;
    if (eval_b == 6) {
      check_cb_called = 1;
      iVar1 = uv_check_stop(&check_handle);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        uv_close((uv_handle_t *)&client,(uv_close_cb)0x0);
        uv_close((uv_handle_t *)&check_handle,(uv_close_cb)0x0);
        uv_close((uv_handle_t *)&server,(uv_close_cb)0x0);
        return;
      }
      pcVar3 = "0";
      pcVar2 = "uv_check_stop(handle)";
      uVar4 = 0x48;
    }
    else {
      pcVar3 = "recv_cnt";
      pcVar2 = "5+1";
      uVar4 = 0x44;
    }
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
  }
  else {
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar2 = "&check_handle";
    uVar4 = 0x3d;
    pcVar3 = "handle";
    eval_a = (int64_t)&check_handle;
    eval_b = (int64_t)handle;
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-recv-in-a-row.c"
          ,uVar4,pcVar2,"==",pcVar3,eval_a,"==",eval_b);
  abort();
}

Assistant:

static void check_cb(uv_check_t* handle) {
  ASSERT_OK(uv_check_stop(&check_handle));
  ASSERT_OK(uv_timer_stop(&timer_handle));  /* Runs before timer_cb. */
  ASSERT_OK(uv_timer_start(&timer_handle, timer_cb, 50, 0));
  ASSERT_OK(uv_prepare_start(&prepare_handle, prepare_cb));
  ASSERT_OK(prepare_cb_called);
  ASSERT_OK(check_cb_called);
  ASSERT_OK(timer_cb_called);
  check_cb_called++;
}